

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError WriteStream(PaStream *s,void *buffer,unsigned_long frames)

{
  PaUtilZeroer *pPVar1;
  snd_pcm_state_t sVar2;
  int iVar3;
  unsigned_long uVar4;
  pthread_t __thread1;
  long errorCode;
  PaAlsaStream *in_RDX;
  int *in_RSI;
  PaUtilBufferProcessor *in_RDI;
  PaAlsaStream *unaff_retaddr;
  int __pa_unsure_error_id;
  snd_pcm_uframes_t hwAvail;
  int xrun;
  snd_pcm_t *save;
  void *userBuffer;
  snd_pcm_uframes_t framesAvail;
  snd_pcm_uframes_t framesGot;
  PaAlsaStream *stream;
  long err;
  PaError result;
  PaAlsaStream *self;
  PaHostApiTypeId hostApiType;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  PaAlsaStream *in_stack_ffffffffffffffa0;
  int *__dest;
  PaAlsaStream *in_stack_ffffffffffffffc0;
  PaAlsaStream *buffer_00;
  PaError local_1c;
  PaAlsaStream *local_18;
  int *xrunOccurred;
  PaUtilBufferProcessor *framesAvail_00;
  
  local_1c = 0;
  pPVar1 = in_RDI[2].outputZeroer;
  if (*(long *)&in_RDI[2].hostOutputIsInterleaved == 0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->playback.pcm\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4448\n"
                     );
    local_1c = -0x26f6;
  }
  else {
    in_RDI[2].outputZeroer = (PaUtilZeroer *)0x0;
    if (0.0 < *(double *)&in_RDI[2].userOutputSampleFormatIsEqualToHost) {
      local_1c = -0x26fc;
      in_RDI[2].userOutputSampleFormatIsEqualToHost = 0;
      in_RDI[2].userInputSampleFormatIsEqualToHost = 0;
    }
    local_18 = in_RDX;
    xrunOccurred = in_RSI;
    framesAvail_00 = in_RDI;
    if (in_RDI[2].hostInputIsInterleaved == 0) {
      __dest = *(int **)&in_RDI[2].ditherGenerator;
      memcpy(__dest,in_RSI,(long)(int)in_RDI[2].callbackStatusFlags << 3);
      in_RSI = __dest;
    }
    do {
      if (local_18 == (PaAlsaStream *)0x0) goto LAB_001157a7;
      paUtilErr_ = PaAlsaStream_WaitForFrames
                             (unaff_retaddr,&framesAvail_00->framesPerUserBuffer,xrunOccurred);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4472\n"
                         );
        local_1c = paUtilErr_;
        goto LAB_001157a7;
      }
      self = local_18;
      if (in_stack_ffffffffffffffc0 < local_18) {
        self = in_stack_ffffffffffffffc0;
      }
      buffer_00 = self;
      paUtilErr_ = PaAlsaStream_SetUpBuffers(self,(unsigned_long *)in_stack_ffffffffffffffc0,in_RSI)
      ;
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4475\n"
                         );
        local_1c = paUtilErr_;
        goto LAB_001157a7;
      }
      if (buffer_00 != (PaAlsaStream *)0x0) {
        uVar4 = PaUtil_CopyOutput(in_RDI,(void **)buffer_00,(unsigned_long)in_stack_ffffffffffffffc0
                                 );
        paUtilErr_ = PaAlsaStream_EndProcessing
                               (in_stack_ffffffffffffffa0,
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                (int *)self);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4479\n"
                           );
          local_1c = paUtilErr_;
          goto LAB_001157a7;
        }
        local_18 = (PaAlsaStream *)((long)local_18 - uVar4);
      }
      hostApiType = (PaHostApiTypeId)((ulong)self >> 0x20);
      in_stack_ffffffffffffffc0 = (PaAlsaStream *)GetStreamWriteAvailable(in_RSI);
      paUtilErr_ = (PaError)in_stack_ffffffffffffffc0;
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'err = GetStreamWriteAvailable( stream )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4486\n"
                         );
        local_1c = paUtilErr_;
        goto LAB_001157a7;
      }
      in_stack_ffffffffffffffa0 =
           (PaAlsaStream *)(in_RDI[2].hostOutputFrameCount[1] - (long)in_stack_ffffffffffffffc0);
      sVar2 = (*alsa_snd_pcm_state)(*(snd_pcm_t **)&in_RDI[2].hostOutputIsInterleaved);
    } while (((sVar2 != SND_PCM_STATE_PREPARED) ||
             (in_stack_ffffffffffffffa0 < (PaAlsaStream *)in_RDI[2].hostOutputFrameCount[0])) ||
            (in_stack_ffffffffffffff9c =
                  (*(code *)alsa_snd_pcm_start)(*(undefined8 *)&in_RDI[2].hostOutputIsInterleaved),
            -1 < in_stack_ffffffffffffff9c));
    __thread1 = pthread_self();
    iVar3 = pthread_equal(__thread1,paUnixMainThread);
    if (iVar3 != 0) {
      errorCode = (long)in_stack_ffffffffffffff9c;
      (*alsa_snd_strerror)(in_stack_ffffffffffffff9c);
      PaUtil_SetLastHostErrorInfo(hostApiType,errorCode,(char *)0x115784);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_start( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4493\n"
                     );
    local_1c = -9999;
  }
LAB_001157a7:
  in_RDI[2].outputZeroer = pPVar1;
  return local_1c;
}

Assistant:

static PaError WriteStream( PaStream* s,
                            const void *buffer,
                            unsigned long frames )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) buffer;
    (void) frames;
    (void) stream;
    
    /* IMPLEMENT ME, see portaudio.h for required behavior*/

    return paNoError;
}